

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adler32.c
# Opt level: O2

uLong adler32(uLong adler,Bytef *buf,uInt len)

{
  undefined1 auVar1 [16];
  long lVar2;
  ulong uVar3;
  ulong uVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  ulong uVar14;
  uLong uVar15;
  ulong uVar16;
  long lVar17;
  long lVar18;
  long lVar19;
  long lVar20;
  long lVar21;
  long lVar22;
  long lVar23;
  uInt uVar24;
  Bytef *pBVar25;
  
  uVar16 = adler & 0xffff;
  uVar3 = adler >> 0x10 & 0xffff;
  if (len == 1) {
    uVar14 = uVar16 + *buf;
    uVar16 = (uVar16 - 0xfff1) + (ulong)*buf;
    if (uVar14 < 0xfff1) {
      uVar16 = uVar14;
    }
    uVar4 = (uVar3 + uVar16) * 0x10000;
    uVar14 = uVar4 - 0xfff10000;
    if (uVar3 + uVar16 < 0xfff1) {
      uVar14 = uVar4;
    }
    uVar15 = uVar14 | uVar16;
  }
  else if (buf == (Bytef *)0x0) {
    uVar15 = 1;
  }
  else if (len < 0x10) {
    for (lVar5 = 0; len != (uInt)lVar5; lVar5 = lVar5 + 1) {
      uVar16 = uVar16 + buf[lVar5];
      uVar3 = uVar3 + uVar16;
    }
    uVar14 = uVar16 - 0xfff1;
    if (uVar16 < 0xfff1) {
      uVar14 = uVar16;
    }
    auVar1._8_8_ = 0;
    auVar1._0_8_ = uVar3;
    uVar15 = (uint)(SUB164(auVar1 % ZEXT816(0xfff1),0) << 0x10) | uVar14;
  }
  else {
    lVar5 = 0;
    pBVar25 = buf;
    uVar24 = len;
    while (0x15af < uVar24) {
      uVar24 = uVar24 - 0x15b0;
      lVar2 = 0;
      do {
        lVar6 = pBVar25[lVar2] + uVar16;
        lVar17 = (ulong)pBVar25[lVar2 + 1] + lVar6;
        lVar7 = (ulong)pBVar25[lVar2 + 2] + lVar17;
        lVar18 = (ulong)pBVar25[lVar2 + 3] + lVar7;
        lVar8 = (ulong)pBVar25[lVar2 + 4] + lVar18;
        lVar19 = (ulong)pBVar25[lVar2 + 5] + lVar8;
        lVar9 = (ulong)pBVar25[lVar2 + 6] + lVar19;
        lVar20 = (ulong)pBVar25[lVar2 + 7] + lVar9;
        lVar10 = (ulong)pBVar25[lVar2 + 8] + lVar20;
        lVar21 = (ulong)pBVar25[lVar2 + 9] + lVar10;
        lVar11 = (ulong)pBVar25[lVar2 + 10] + lVar21;
        lVar22 = (ulong)pBVar25[lVar2 + 0xb] + lVar11;
        lVar12 = (ulong)pBVar25[lVar2 + 0xc] + lVar22;
        lVar23 = (ulong)pBVar25[lVar2 + 0xd] + lVar12;
        lVar13 = (ulong)pBVar25[lVar2 + 0xe] + lVar23;
        uVar16 = (ulong)pBVar25[lVar2 + 0xf] + lVar13;
        uVar3 = uVar3 + lVar6 + lVar17 + lVar7 + lVar18 + lVar8 + lVar19 + lVar9 + lVar20 + lVar10 +
                lVar21 + lVar11 + lVar22 + lVar12 + lVar23 + lVar13 + uVar16;
        lVar2 = lVar2 + 0x10;
      } while ((int)lVar2 != 0x15b0);
      pBVar25 = pBVar25 + 0x15b0;
      uVar16 = uVar16 % 0xfff1;
      uVar3 = uVar3 % 0xfff1;
      lVar5 = lVar5 + 0x15b0;
    }
    if (uVar24 != 0) {
      for (; 0xf < uVar24; uVar24 = uVar24 - 0x10) {
        lVar22 = uVar16 + buf[lVar5];
        lVar2 = (ulong)buf[lVar5 + 1] + lVar22;
        lVar12 = (ulong)buf[lVar5 + 2] + lVar2;
        lVar6 = (ulong)buf[lVar5 + 3] + lVar12;
        lVar13 = (ulong)buf[lVar5 + 4] + lVar6;
        lVar7 = (ulong)buf[lVar5 + 5] + lVar13;
        lVar17 = (ulong)buf[lVar5 + 6] + lVar7;
        lVar8 = (ulong)buf[lVar5 + 7] + lVar17;
        lVar18 = (ulong)buf[lVar5 + 8] + lVar8;
        lVar9 = (ulong)buf[lVar5 + 9] + lVar18;
        lVar19 = (ulong)buf[lVar5 + 10] + lVar9;
        lVar10 = (ulong)buf[lVar5 + 0xb] + lVar19;
        lVar20 = (ulong)buf[lVar5 + 0xc] + lVar10;
        lVar11 = (ulong)buf[lVar5 + 0xd] + lVar20;
        lVar21 = (ulong)buf[lVar5 + 0xe] + lVar11;
        uVar16 = (ulong)buf[lVar5 + 0xf] + lVar21;
        uVar3 = uVar3 + lVar22 + lVar2 + lVar12 + lVar6 + lVar13 + lVar7 + lVar17 + lVar8 + lVar18 +
                lVar9 + lVar19 + lVar10 + lVar20 + lVar11 + lVar21 + uVar16;
        lVar5 = lVar5 + 0x10;
      }
      for (; len != (uInt)lVar5; lVar5 = lVar5 + 1) {
        uVar16 = uVar16 + buf[lVar5];
        uVar3 = uVar3 + uVar16;
      }
      uVar16 = uVar16 % 0xfff1;
      uVar3 = uVar3 % 0xfff1;
    }
    uVar15 = uVar3 << 0x10 | uVar16;
  }
  return uVar15;
}

Assistant:

uLong ZEXPORT adler32(uLong adler, const Bytef *buf, uInt len)
{
    unsigned long sum2;
    unsigned n;

    /* split Adler-32 into component sums */
    sum2 = (adler >> 16) & 0xffff;
    adler &= 0xffff;

    /* in case user likes doing a byte at a time, keep it fast */
    if (len == 1) {
        adler += buf[0];
        if (adler >= BASE)
            adler -= BASE;
        sum2 += adler;
        if (sum2 >= BASE)
            sum2 -= BASE;
        return adler | (sum2 << 16);
    }

    /* initial Adler-32 value (deferred check for len == 1 speed) */
    if (buf == Z_NULL)
        return 1L;

    /* in case short lengths are provided, keep it somewhat fast */
    if (len < 16) {
        while (len--) {
            adler += *buf++;
            sum2 += adler;
        }
        if (adler >= BASE)
            adler -= BASE;
        MOD4(sum2);             /* only added so many BASE's */
        return adler | (sum2 << 16);
    }

    /* do length NMAX blocks -- requires just one modulo operation */
    while (len >= NMAX) {
        len -= NMAX;
        n = NMAX / 16;          /* NMAX is divisible by 16 */
        do {
            DO16(buf);          /* 16 sums unrolled */
            buf += 16;
        } while (--n);
        MOD(adler);
        MOD(sum2);
    }

    /* do remaining bytes (less than NMAX, still just one modulo) */
    if (len) {                  /* avoid modulos if none remaining */
        while (len >= 16) {
            len -= 16;
            DO16(buf);
            buf += 16;
        }
        while (len--) {
            adler += *buf++;
            sum2 += adler;
        }
        MOD(adler);
        MOD(sum2);
    }

    /* return recombined sums */
    return adler | (sum2 << 16);
}